

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O3

StatusCode __thiscall HttpConn::parseRequest(HttpConn *this)

{
  pointer pcVar1;
  int end_idx;
  StatusCode SVar2;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var3;
  ParseState PVar4;
  
switchD_00117ce4_default:
  switch(this->parseState_) {
  case CheckRequestLine:
    pcVar1 = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    _Var3 = std::
            __search<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (pcVar1 + this->checked_idx_,pcVar1 + this->read_idx_,"\r\n","");
    if (_Var3._M_current ==
        (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return Wait;
    }
    end_idx = (int)_Var3._M_current - (int)pcVar1;
    if (end_idx == -1) {
      return Wait;
    }
    SVar2 = parseRequesetLine(this,end_idx);
    PVar4 = CheckHeaders;
    if (SVar2 != OK) {
      if (SVar2 == BadRequest) {
        std::__cxx11::string::_M_replace
                  ((ulong)&this->body_,0,(char *)(this->body_)._M_string_length,0x121b22);
        return BadRequest;
      }
      goto switchD_00117ce4_default;
    }
    break;
  case CheckHeaders:
    SVar2 = parseHeader(this);
    PVar4 = CheckBody;
    if (SVar2 != OK) {
      return Wait;
    }
    break;
  case CheckBody:
    goto switchD_00117ce4_caseD_2;
  case Finished:
    goto switchD_00117ce4_caseD_3;
  default:
    goto switchD_00117ce4_default;
  }
  this->parseState_ = PVar4;
  goto switchD_00117ce4_default;
switchD_00117ce4_caseD_2:
  SVar2 = parseBody(this);
  if (SVar2 != Wait) {
    if (SVar2 != OK) {
      return Wait;
    }
    this->parseState_ = Finished;
    SVar2 = processRequest(this);
    return SVar2;
  }
  goto switchD_00117ce4_default;
switchD_00117ce4_caseD_3:
  return Wait;
}

Assistant:

HttpConn::StatusCode HttpConn::parseRequest() {
    StatusCode code;
    bool hasMore = true;
    while (hasMore) {
    
        switch (parseState_) {
        case CheckRequestLine: 
        {
            int idx = findCRLF(checked_idx_);
            if (idx != -1) {
                code = parseRequesetLine(idx);
                if (code == OK){ 
                    parseState_ = CheckHeaders; 
                }
                else if (code == BadRequest) { 
                    body_ = "Error Request Line!";
                    return BadRequest; 
                }
            } else {
                hasMore = false;
            }
            break;
        }
        case CheckHeaders:
        {
            code = parseHeader();
            if (code == OK) {
                parseState_ = CheckBody;
            } else if (code == BadRequest) {
                body_  = "Error Header!";
                return BadRequest;
            }
            else hasMore = false;
            break;
        }
        case CheckBody:
        {
            code = parseBody();
            if (code == OK) {
                parseState_ = Finished;
                return processRequest();
            } 
            if (code != Wait)
                hasMore = false;
            break;
        }
        case Finished: hasMore = false; break;

    }

    }
    return Wait;
}